

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O0

uchar * convert_image_to_DXT1(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  int iVar1;
  int local_98;
  int local_94;
  int my;
  int mx;
  int idx;
  int block_count;
  int chan_step;
  int index;
  uchar cblock [8];
  uchar ublock [48];
  int y;
  int x;
  int j;
  int i;
  uchar *compressed;
  int *out_size_local;
  int channels_local;
  int height_local;
  int width_local;
  uchar *uncompressed_local;
  
  block_count = 0;
  *out_size = 0;
  if ((((width < 1) || (height < 1)) || (uncompressed == (uchar *)0x0)) ||
     ((channels < 1 || (4 < channels)))) {
    uncompressed_local = (uchar *)0x0;
  }
  else {
    idx = (int)(2 < channels);
    *out_size = (width + 3 >> 2) * (height + 3 >> 2) * 8;
    uncompressed_local = (uchar *)malloc((long)*out_size);
    for (y = 0; y < height; y = y + 4) {
      for (x = 0; x < width; x = x + 4) {
        my = 0;
        local_94 = 4;
        local_98 = 4;
        if (height <= y + 4) {
          local_98 = height - y;
        }
        if (width <= x + 4) {
          local_94 = width - x;
        }
        ublock[0x28] = '\0';
        ublock[0x29] = '\0';
        ublock[0x2a] = '\0';
        ublock[0x2b] = '\0';
        for (; (int)ublock._40_4_ < local_98; ublock._40_4_ = ublock._40_4_ + 1) {
          ublock[0x2c] = '\0';
          ublock[0x2d] = '\0';
          ublock[0x2e] = '\0';
          ublock[0x2f] = '\0';
          for (; (int)ublock._44_4_ < local_94; ublock._44_4_ = ublock._44_4_ + 1) {
            cblock[my] = uncompressed
                         [(y + ublock._40_4_) * width * channels + (x + ublock._44_4_) * channels];
            iVar1 = my + 2;
            cblock[my + 1] =
                 uncompressed
                 [(y + ublock._40_4_) * width * channels + (x + ublock._44_4_) * channels + idx];
            my = my + 3;
            cblock[iVar1] =
                 uncompressed
                 [(y + ublock._40_4_) * width * channels + (x + ublock._44_4_) * channels + idx * 2]
            ;
          }
          ublock[0x2c] = (undefined1)local_94;
          ublock[0x2d] = local_94._1_1_;
          ublock[0x2e] = local_94._2_1_;
          ublock[0x2f] = local_94._3_1_;
          for (; (int)ublock._44_4_ < 4; ublock._44_4_ = ublock._44_4_ + 1) {
            cblock[my] = cblock[0];
            iVar1 = my + 2;
            cblock[my + 1] = cblock[1];
            my = my + 3;
            cblock[iVar1] = cblock[2];
          }
        }
        ublock[0x28] = (undefined1)local_98;
        ublock[0x29] = local_98._1_1_;
        ublock[0x2a] = local_98._2_1_;
        ublock[0x2b] = local_98._3_1_;
        for (; (int)ublock._40_4_ < 4; ublock._40_4_ = ublock._40_4_ + 1) {
          ublock[0x2c] = '\0';
          ublock[0x2d] = '\0';
          ublock[0x2e] = '\0';
          ublock[0x2f] = '\0';
          for (; (int)ublock._44_4_ < 4; ublock._44_4_ = ublock._44_4_ + 1) {
            cblock[my] = cblock[0];
            iVar1 = my + 2;
            cblock[my + 1] = cblock[1];
            my = my + 3;
            cblock[iVar1] = cblock[2];
          }
        }
        compress_DDS_color_block(3,cblock,(uchar *)&chan_step);
        ublock[0x2c] = '\0';
        ublock[0x2d] = '\0';
        ublock[0x2e] = '\0';
        ublock[0x2f] = '\0';
        for (; (int)ublock._44_4_ < 8; ublock._44_4_ = ublock._44_4_ + 1) {
          uncompressed_local[block_count] = *(uchar *)((long)&chan_step + (long)(int)ublock._44_4_);
          block_count = block_count + 1;
        }
      }
    }
  }
  return uncompressed_local;
}

Assistant:

unsigned char* convert_image_to_DXT1(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*3];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || (channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B values	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	get the RAM for the compressed image
		(8 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 8;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	copy this block into a new one	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			/*	compress the block	*/
			++block_count;
			compress_DDS_color_block( 3, ublock, cblock );
			/*	copy the data from the block into the main block	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}